

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzFind.c
# Opt level: O3

UInt32 * Hc_GetMatchesSpec(UInt32 lenLimit,UInt32 curMatch,UInt32 pos,Byte *cur,CLzRef *son,
                          UInt32 _cyclicBufferPos,UInt32 _cyclicBufferSize,UInt32 cutValue,
                          UInt32 *distances,UInt32 maxLen)

{
  CLzRef CVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  UInt32 UVar5;
  UInt32 UVar6;
  Byte *pBVar7;
  UInt32 *local_40;
  
  local_40 = distances;
  son[_cyclicBufferPos] = curMatch;
  uVar2 = pos - curMatch;
  if (_cyclicBufferSize <= uVar2 || cutValue == 0) {
    return distances;
  }
  do {
    pBVar7 = cur + -(ulong)uVar2;
    UVar5 = 0;
    if (_cyclicBufferPos < uVar2) {
      UVar5 = _cyclicBufferSize;
    }
    CVar1 = son[(_cyclicBufferPos - uVar2) + UVar5];
    if ((pBVar7[maxLen] == cur[maxLen]) && (*pBVar7 == *cur)) {
      uVar4 = 1;
      UVar5 = 0;
      do {
        if (uVar4 - (lenLimit - 1) == 1) {
          UVar5 = lenLimit;
          UVar6 = (UInt32)uVar4;
          break;
        }
        uVar3 = uVar4 & 0xffffffff;
        uVar4 = uVar4 + 1;
        UVar5 = UVar5 + 1;
        UVar6 = UVar5;
      } while (pBVar7[uVar3] == cur[uVar3]);
      if (maxLen < UVar5) {
        *local_40 = UVar5;
        local_40[1] = uVar2 - 1;
        local_40 = local_40 + 2;
        maxLen = UVar5;
        if (UVar6 == lenLimit) {
          return local_40;
        }
      }
    }
    cutValue = cutValue - 1;
    if (cutValue == 0) {
      return local_40;
    }
    uVar2 = pos - CVar1;
    if (_cyclicBufferSize <= uVar2) {
      return local_40;
    }
  } while( true );
}

Assistant:

static UInt32 * Hc_GetMatchesSpec(UInt32 lenLimit, UInt32 curMatch, UInt32 pos, const Byte *cur, CLzRef *son,
    UInt32 _cyclicBufferPos, UInt32 _cyclicBufferSize, UInt32 cutValue,
    UInt32 *distances, UInt32 maxLen)
{
  son[_cyclicBufferPos] = curMatch;
  for (;;)
  {
    UInt32 delta = pos - curMatch;
    if (cutValue-- == 0 || delta >= _cyclicBufferSize)
      return distances;
    {
      const Byte *pb = cur - delta;
      curMatch = son[_cyclicBufferPos - delta + ((delta > _cyclicBufferPos) ? _cyclicBufferSize : 0)];
      if (pb[maxLen] == cur[maxLen] && *pb == *cur)
      {
        UInt32 len = 0;
        while (++len != lenLimit)
          if (pb[len] != cur[len])
            break;
        if (maxLen < len)
        {
          *distances++ = maxLen = len;
          *distances++ = delta - 1;
          if (len == lenLimit)
            return distances;
        }
      }
    }
  }
}